

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

UniValue *
wallet::SendMoney(UniValue *__return_storage_ptr__,CWallet *wallet,CCoinControl *coin_control,
                 vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
                 mapValue_t map_value,bool verbose)

{
  long lVar1;
  __normal_iterator<wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
  __first;
  __normal_iterator<wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
  __last;
  string str;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  undefined1 auVar2 [24];
  bool bVar3;
  T *pTVar4;
  UniValue *pUVar5;
  FeeReason reason;
  bilingual_str *this;
  undefined7 in_register_00000081;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  CTransactionRef tx;
  undefined4 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd70;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  undefined1 in_stack_fffffffffffffd90 [16];
  undefined1 in_stack_fffffffffffffda0 [48];
  undefined1 local_208 [120];
  string local_190 [32];
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  bilingual_str local_120;
  Result<wallet::CreatedTransactionResult> res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  EnsureWalletIsUnlocked(wallet);
  bVar3 = CWallet::IsWalletFlagSet(wallet,0x100000000);
  if (bVar3) {
    pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&res,"Error: Private keys are disabled for this wallet",
               (allocator<char> *)&local_120);
    JSONRPCError(pUVar5,-4,(string *)&res);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    __first._M_current =
         (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    FastRandomContext::FastRandomContext((FastRandomContext *)&res,false);
    std::
    shuffle<__gnu_cxx::__normal_iterator<wallet::CRecipient*,std::vector<wallet::CRecipient,std::allocator<wallet::CRecipient>>>,FastRandomContext>
              (__first,__last,(FastRandomContext *)&res);
    ChaCha20::~ChaCha20((ChaCha20 *)
                        ((long)&res.m_variant.
                                super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>
                                .
                                super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                .
                                super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                .
                                super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                .
                                super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                        + 0x10));
    CreateTransaction(&res,wallet,recipients,(optional<unsigned_int>)0x0,coin_control,true);
    if (res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
        '\x01') {
      pTVar4 = util::Result<wallet::CreatedTransactionResult>::value(&res);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xfffffffffffffd90,
                 (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)pTVar4);
      std::_Rb_tree_header::_Rb_tree_header
                (&local_150._M_impl.super__Rb_tree_header,
                 (_Rb_tree_header *)(CONCAT71(in_register_00000081,verbose) + 8));
      ppVar6 = (pointer)0x0;
      ppVar7 = (pointer)0x0;
      ppVar8 = (pointer)0x0;
      auVar2._16_8_ = 0;
      auVar2._0_16_ = in_stack_fffffffffffffd90;
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_150;
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&stack0xfffffffffffffd90;
      CWallet::CommitTransaction
                (wallet,tx,
                 (mapValue_t)
                 ZEXT3248(CONCAT824(in_stack_fffffffffffffd70,
                                    CONCAT816(coin_control,
                                              CONCAT88(__return_storage_ptr__,
                                                       CONCAT44(in_R9D,in_stack_fffffffffffffd58))))
                         ),
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )(auVar2 << 0x40));
      _GLOBAL__N_1::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&stack0xfffffffffffffd78);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_150);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffd98);
      if ((char)in_R9D == '\0') {
        base_blob<256u>::GetHex_abi_cxx11_
                  (&local_120.original,
                   (base_blob<256u> *)
                   &((pTVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->hash);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,&local_120.original);
        this = &local_120;
      }
      else {
        local_170 = local_160;
        local_168 = 0;
        local_160[0] = 0;
        str._M_dataplus._M_p._4_4_ = in_R9D;
        str._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffd58;
        str._M_string_length = (size_type)__return_storage_ptr__;
        str.field_2._M_allocated_capacity = (size_type)coin_control;
        str.field_2._8_8_ = in_stack_fffffffffffffd70;
        pUVar5 = __return_storage_ptr__;
        UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_190,"txid",(allocator<char> *)&stack0xfffffffffffffd77);
        base_blob<256u>::GetHex_abi_cxx11_
                  (&local_120.original,
                   (base_blob<256u> *)
                   &((pTVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->hash);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)(local_208 + 0x20),&local_120.original);
        key._M_dataplus._M_p._4_4_ = in_R9D;
        key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffd58;
        key._M_string_length = (size_type)pUVar5;
        key.field_2._M_allocated_capacity = (size_type)coin_control;
        key.field_2._8_8_ = in_stack_fffffffffffffd70;
        val.val._M_dataplus._M_p = (pointer)ppVar7;
        val._0_8_ = ppVar6;
        val.val._M_string_length = (size_type)ppVar8;
        val.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd90;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffda0._0_24_;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffda0._24_24_;
        UniValue::pushKV(__return_storage_ptr__,key,val);
        UniValue::~UniValue((UniValue *)(local_208 + 0x20));
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_208,"fee_reason",(allocator<char> *)&stack0xfffffffffffffd77);
        pTVar4 = util::Result<wallet::CreatedTransactionResult>::value(&res);
        common::StringForFeeReason_abi_cxx11_
                  (&local_120.original,(common *)(ulong)(pTVar4->fee_calc).reason,reason);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)&stack0xfffffffffffffda0,&local_120.original);
        key_00._M_dataplus._M_p._4_4_ = in_R9D;
        key_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffd58;
        key_00._M_string_length = (size_type)pUVar5;
        key_00.field_2._M_allocated_capacity = (size_type)coin_control;
        key_00.field_2._8_8_ = in_stack_fffffffffffffd70;
        val_00.val._M_dataplus._M_p = (pointer)ppVar7;
        val_00._0_8_ = ppVar6;
        val_00.val._M_string_length = (size_type)ppVar8;
        val_00.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd90;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffda0._0_24_;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffda0._24_24_;
        UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
        UniValue::~UniValue((UniValue *)&stack0xfffffffffffffda0);
        std::__cxx11::string::~string((string *)&local_120);
        this = (bilingual_str *)local_208;
      }
      std::__cxx11::string::~string((string *)this);
      _GLOBAL__N_1::std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)&res);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      util::ErrorString<wallet::CreatedTransactionResult>(&local_120,&res);
      JSONRPCError(pUVar5,-6,&local_120.original);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

UniValue SendMoney(CWallet& wallet, const CCoinControl &coin_control, std::vector<CRecipient> &recipients, mapValue_t map_value, bool verbose)
{
    EnsureWalletIsUnlocked(wallet);

    // This function is only used by sendtoaddress and sendmany.
    // This should always try to sign, if we don't have private keys, don't try to do anything here.
    if (wallet.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: Private keys are disabled for this wallet");
    }

    // Shuffle recipient list
    std::shuffle(recipients.begin(), recipients.end(), FastRandomContext());

    // Send
    auto res = CreateTransaction(wallet, recipients, /*change_pos=*/std::nullopt, coin_control, true);
    if (!res) {
        throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, util::ErrorString(res).original);
    }
    const CTransactionRef& tx = res->tx;
    wallet.CommitTransaction(tx, std::move(map_value), /*orderForm=*/{});
    if (verbose) {
        UniValue entry(UniValue::VOBJ);
        entry.pushKV("txid", tx->GetHash().GetHex());
        entry.pushKV("fee_reason", StringForFeeReason(res->fee_calc.reason));
        return entry;
    }
    return tx->GetHash().GetHex();
}